

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.cpp
# Opt level: O0

void __thiscall
Imf_3_2::TypedDeepImageChannel<float>::resetBasePointer(TypedDeepImageChannel<float> *this)

{
  int iVar1;
  _func_int **pp_Var2;
  int iVar3;
  ImageLevel *pIVar4;
  Box2i *pBVar5;
  ImageChannel *in_RDI;
  
  pp_Var2 = in_RDI[1]._vptr_ImageChannel;
  pIVar4 = ImageChannel::level(in_RDI);
  pBVar5 = ImageLevel::dataWindow(pIVar4);
  iVar1 = (pBVar5->min).y;
  iVar3 = ImageChannel::pixelsPerRow(in_RDI);
  pIVar4 = ImageChannel::level(in_RDI);
  pBVar5 = ImageLevel::dataWindow(pIVar4);
  in_RDI[1]._level = (ImageLevel *)(pp_Var2 + (-(long)(iVar1 * iVar3) - (long)(pBVar5->min).x));
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::resetBasePointer ()
{
    _base = _sampleListPointers -
            level ().dataWindow ().min.y * pixelsPerRow () -
            level ().dataWindow ().min.x;
}